

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  byte *local_28;
  ulong local_20;
  byte local_18 [16];
  
  if ((text->_M_string_length == 0) ||
     ((bVar2 = *(text->_M_dataplus)._M_p, bVar2 != 0x5f && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)))))
  {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_28,(ulong)text);
    bVar4 = local_20 == 0;
    if (!bVar4) {
      bVar2 = *local_28;
      if (((bVar2 == 0x5f) || ((byte)(bVar2 - 0x30) < 10)) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)
         ) {
        uVar1 = 1;
        do {
          uVar3 = uVar1;
          if (local_20 == uVar3) break;
          bVar2 = local_28[uVar3];
          uVar1 = uVar3 + 1;
        } while (((bVar2 == 0x5f) || ((byte)(bVar2 - 0x30) < 10)) ||
                ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a));
        bVar4 = local_20 <= uVar3;
      }
      else {
        bVar4 = false;
      }
    }
    if (local_28 != local_18) {
      operator_delete(local_28);
    }
  }
  return bVar4;
}

Assistant:

bool Tokenizer::IsIdentifier(const std::string& text) {
  // Mirrors IDENTIFIER definition in Tokenizer::Next() above.
  if (text.size() == 0) return false;
  if (!Letter::InClass(text.at(0))) return false;
  if (!AllInClass<Alphanumeric>(text.substr(1))) return false;
  return true;
}